

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdsubrs.c
# Opt level: O2

void KB_beep(LispPTR *args)

{
  if (*args == 0x4c) {
    beep_Xkeyboard(currentdsp);
    return;
  }
  return;
}

Assistant:

void KB_beep(LispPTR *args) /* args[0] :	ON/OFF flag
                                   *		T -- ON
                                   *		NIL -- OFF
                                   * args[1] :	frequency
                                   */
{
#if   XWINDOW
  if (args[0] == ATOM_T) beep_Xkeyboard(currentdsp);
#elif DOS
  if (args[0] == ATOM_T) {
    bell_status_word = inp(0x61);
    outp(0x61, bell_status_word | 0x3); /* Turn on the speaker */
    /* Prepare timer by sending 10111100 to port 43. */
    outp(0x43, 0xb6);

    /* Divide input frequency by timer ticks per second and
     * write (byte by byte) to timer. */
    outp(0x42, (char)(1193180L / (LispIntToCInt(args[1]))));
    outp(0x42, (char)(1193180L / (LispIntToCInt(args[1])) >> 8));
  } else {
    outp(0x61, bell_status_word & ~0x3); /* Turn off the speaker (with */
    /* bits 0 and 1). */
  }
#endif /* SUNDISPLAY, XWINDOW, DOS */
}